

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::helper::
     heapsort<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
               (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator SA,
               value_type size)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  pos_type pVar5;
  long lVar6;
  BitmapArray<long> *pBVar7;
  long lVar8;
  ulong size_00;
  ulong size_01;
  
  pVar5 = SA.pos_;
  pBVar7 = SA.array_;
  size_00 = size;
  if ((size & 1U) == 0) {
    size_00 = size - 1;
    lVar6 = ((size - ((long)size_00 >> 0x3f)) + -1 >> 1) + pVar5;
    iVar3 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7);
    iVar3 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                      (Td.m_PA.array_,CONCAT44(extraout_var,iVar3) + Td.m_PA.pos_);
    cVar1 = Td.m_Td[CONCAT44(extraout_var_00,iVar3)];
    lVar8 = size + -1 + pVar5;
    iVar3 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7);
    iVar3 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                      (Td.m_PA.array_,Td.m_PA.pos_ + CONCAT44(extraout_var_01,iVar3));
    if (cVar1 < Td.m_Td[CONCAT44(extraout_var_02,iVar3)]) {
      iVar3 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,lVar8);
      iVar4 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,lVar6);
      (*(pBVar7->super_Bitmap)._vptr_Bitmap[4])(pBVar7,lVar8,CONCAT44(extraout_var_04,iVar4));
      (*(pBVar7->super_Bitmap)._vptr_Bitmap[4])(pBVar7,lVar6,CONCAT44(extraout_var_03,iVar3));
    }
  }
  if (1 < (long)size_00) {
    lVar8 = (size_00 >> 1) + 1;
    do {
      fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
                (Td,SA,lVar8 + -2,size_00);
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  if ((size & 1U) == 0) {
    iVar3 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,pVar5);
    iVar4 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,size_00 + pVar5);
    (*(pBVar7->super_Bitmap)._vptr_Bitmap[4])(pBVar7,pVar5,CONCAT44(extraout_var_06,iVar4));
    (*(pBVar7->super_Bitmap)._vptr_Bitmap[4])
              (pBVar7,size_00 + pVar5,CONCAT44(extraout_var_05,iVar3));
    fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
              (Td,SA,0,size_00);
  }
  if (1 < (long)size_00) {
    do {
      size_01 = size_00 - 1;
      iVar3 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,pVar5);
      iVar4 = (*(pBVar7->super_Bitmap)._vptr_Bitmap[5])(pBVar7,pVar5 + size_01);
      (*(pBVar7->super_Bitmap)._vptr_Bitmap[4])(pBVar7,pVar5,CONCAT44(extraout_var_08,iVar4));
      fixdown<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator,long>
                (Td,SA,0,size_01);
      (*(pBVar7->super_Bitmap)._vptr_Bitmap[4])
                (pBVar7,pVar5 + size_01,CONCAT44(extraout_var_07,iVar3));
      bVar2 = 2 < (long)size_00;
      size_00 = size_01;
    } while (bVar2);
  }
  return;
}

Assistant:

void heapsort(const StringIterator_type Td, SAIterator_type SA,
              typename std::iterator_traits<SAIterator_type>::value_type size) {
  typedef typename std::iterator_traits<SAIterator_type>::value_type pos_type;
  pos_type i, m;
  pos_type t;

  m = size;
  if ((size % 2) == 0) {
    m--;
    if (Td[SA[m / 2]] < Td[SA[m]]) {
      std::iter_swap(SA + m, SA + m / 2);
    }
  }

  for (i = m / 2 - 1; 0 <= i; --i) {
    fixdown(Td, SA, i, m);
  }

  if ((size % 2) == 0) {
    std::iter_swap(SA, SA + m);
    fixdown(Td, SA, pos_type(0), m);
  }

  for (i = m - 1; 0 < i; --i) {
    t = SA[0];
    SA[0] = SA[i];
    fixdown(Td, SA, pos_type(0), i);
    SA[i] = t;
  }
}